

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

UserData * __thiscall luna::GC::NewUserData(GC *this,GCGeneration gen)

{
  UserData *this_00;
  undefined4 in_ESI;
  UserData *u;
  GCGeneration in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (UserData *)operator_new(0x38);
  UserData::UserData(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x60;
  SetObjectGen((GC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&this_00->super_GCObject,
               in_stack_ffffffffffffffe4);
  return this_00;
}

Assistant:

UserData * GC::NewUserData(GCGeneration gen)
    {
        auto u = new UserData;
        u->gc_obj_type_ = GCObjectType_UserData;
        SetObjectGen(u, gen);
        return u;
    }